

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::View<TestType,_false,_std::allocator<unsigned_long>_>::indexToOffset
          (View<TestType,_false,_std::allocator<unsigned_long>_> *this,size_t index,size_t *out)

{
  size_t *psVar1;
  size_t *psVar2;
  runtime_error *this_00;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  
  testInvariant(this);
  if (index < (this->geometry_).size_) {
    testInvariant(this);
    if ((this->geometry_).isSimple_ == true) {
      *out = index;
      return;
    }
    *out = 0;
    testInvariant(this);
    if ((this->geometry_).coordinateOrder_ == FirstMajorOrder) {
      if (this->data_ == (pointer)0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
      }
      else {
        if ((this->geometry_).dimension_ == 0) {
          return;
        }
        psVar1 = (this->geometry_).shapeStrides_;
        psVar2 = (this->geometry_).strides_;
        sVar4 = *out;
        uVar6 = 0;
        while( true ) {
          sVar4 = (index / psVar1[uVar6]) * psVar2[uVar6] + sVar4;
          *out = sVar4;
          uVar5 = (this->geometry_).dimension_;
          if (uVar5 <= uVar6) break;
          index = index % psVar1[uVar6];
          uVar6 = uVar6 + 1;
          if (uVar5 <= uVar6) {
            return;
          }
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
      }
    }
    else if (this->data_ == (pointer)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
    else {
      sVar4 = (this->geometry_).dimension_;
      if (sVar4 == 0) {
        if (index == 0) {
          return;
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
      }
      else {
        psVar1 = (this->geometry_).shapeStrides_;
        psVar2 = (this->geometry_).strides_;
        sVar3 = (index / psVar1[sVar4 - 1]) * psVar2[sVar4 - 1] + *out;
        uVar6 = sVar4 - 1;
        *out = sVar3;
        if (uVar6 < (this->geometry_).dimension_) {
          do {
            uVar5 = uVar6 - 1;
            if (uVar6 == 0) {
              return;
            }
            index = index % psVar1[uVar6];
            sVar3 = sVar3 + (index / psVar1[uVar5]) * psVar2[uVar5];
            *out = sVar3;
            uVar6 = uVar5;
          } while (uVar5 < (this->geometry_).dimension_);
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
      }
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void
View<T, isConst, A>::indexToOffset
(
    std::size_t index,
    std::size_t& out
) const
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_ARG_TEST || index < this->size()); 
    if(isSimple()) {
        out = index;
    }
    else {
        out = 0;
        if(coordinateOrder() == FirstMajorOrder) {
            for(std::size_t j=0; j<this->dimension(); ++j) {
                out += geometry_.strides(j) * (index / geometry_.shapeStrides(j));
                index = index % geometry_.shapeStrides(j);
            }
        }
        else { // last major order
            if(this->dimension() == 0) {
                marray_detail::Assert(MARRAY_NO_ARG_TEST || index == 0);
                return;
            }
            else {
                std::size_t j = this->dimension()-1;
                for(;;) {
                    out += geometry_.strides(j) * (index / geometry_.shapeStrides(j));
                    index = index % geometry_.shapeStrides(j);
                    if(j == 0) {
                        break;
                    }
                    else {
                        --j;
                    }
                }
            }
        }
    }
}